

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O3

void upb_Array_Set(upb_Array *arr,size_t i,upb_MessageValue val)

{
  ulong uVar1;
  sbyte sVar2;
  double local_10;
  size_t local_8;
  
  local_8 = val.str_val.size;
  local_10 = val.double_val;
  uVar1 = arr->data_dont_copy_me__upb_internal_use_only;
  if ((uVar1 & 4) != 0) {
    __assert_fail("!upb_Array_IsFrozen(arr)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/array.c"
                  ,0x31,"void upb_Array_Set(upb_Array *, size_t, upb_MessageValue)");
  }
  if (i < arr->size_dont_copy_me__upb_internal_use_only) {
    sVar2 = ((uVar1 & 3) != 0) + ((byte)uVar1 & 3);
    memcpy((void *)((i << sVar2) + (uVar1 & 0xfffffffffffffff8)),&local_10,(ulong)(uint)(1 << sVar2)
          );
    return;
  }
  __assert_fail("i < upb_Array_Size(arr)",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/array.c"
                ,0x32,"void upb_Array_Set(upb_Array *, size_t, upb_MessageValue)");
}

Assistant:

void upb_Array_Set(upb_Array* arr, size_t i, upb_MessageValue val) {
  UPB_ASSERT(!upb_Array_IsFrozen(arr));
  UPB_ASSERT(i < upb_Array_Size(arr));
  char* data = upb_Array_MutableDataPtr(arr);
  const int lg2 = UPB_PRIVATE(_upb_Array_ElemSizeLg2)(arr);
  memcpy(data + (i << lg2), &val, 1 << lg2);
}